

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O0

float __thiscall ser::MetainfoSet::AsDouble(MetainfoSet *this,string *key)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  ostream *poVar4;
  any *operand;
  double dVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [380];
  float local_3c;
  type_info *ptStack_38;
  float v;
  type_info *t;
  any *a;
  const_iterator iter;
  string *key_local;
  MetainfoSet *this_local;
  
  iter._M_node = (_Base_ptr)key;
  a = (any *)checkKeyExists(this,key);
  ppVar3 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
                         *)&a);
  t = (type_info *)&ppVar3->second;
  ptStack_38 = boost::any::type((any *)t);
  bVar1 = std::type_info::operator==(ptStack_38,(type_info *)&bool::typeinfo);
  if (bVar1) {
    bVar1 = boost::any_cast<bool>((any *)t);
    this_local._4_4_ = (float)bVar1;
  }
  else {
    bVar1 = std::type_info::operator==(ptStack_38,(type_info *)&int::typeinfo);
    if (bVar1) {
      iVar2 = boost::any_cast<int>((any *)t);
      this_local._4_4_ = (float)iVar2;
    }
    else {
      bVar1 = std::type_info::operator==(ptStack_38,(type_info *)&float::typeinfo);
      if (bVar1) {
        this_local._4_4_ = boost::any_cast<float>((any *)t);
      }
      else {
        bVar1 = std::type_info::operator==(ptStack_38,(type_info *)&double::typeinfo);
        if (bVar1) {
          dVar5 = boost::any_cast<double>((any *)t);
          this_local._4_4_ = (float)dVar5;
        }
        else {
          bVar1 = std::type_info::operator==
                            (ptStack_38,(type_info *)&std::__cxx11::string::typeinfo);
          if (!bVar1) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Bug in MetainfoSet: type of \'");
            poVar4 = std::operator<<(poVar4,(string *)iter._M_node);
            std::operator<<(poVar4,"\' not recognized\n");
            exit(1);
          }
          std::__cxx11::stringstream::stringstream(local_1c8);
          boost::any_cast<std::__cxx11::string>(&local_1e8,(boost *)t,operand);
          std::operator<<(local_1b8,(string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::istream::operator>>((istream *)local_1c8,&local_3c);
          this_local._4_4_ = local_3c;
          std::__cxx11::stringstream::~stringstream(local_1c8);
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

float MetainfoSet::AsDouble(const std::string& key) const
{
    std::map<std::string, boost::any>::const_iterator iter = checkKeyExists(key);
    const boost::any& a = iter->second;
    const std::type_info& t = a.type();

         if(t == typeid(bool)) return boost::any_cast<bool>(a);
    else if(t == typeid(int)) return boost::any_cast<int>(a);
    else if(t == typeid(float)) return boost::any_cast<float>(a);
    else if(t == typeid(double)) return boost::any_cast<double>(a);
    else if(t == typeid(std::string))
    {
        float v;
        std::stringstream ss;
        ss << boost::any_cast<std::string>(a);
        ss >> v;
        return v;
    }

    // Reaching this point is a bug.
    std::cerr << "Bug in MetainfoSet: type of '" << key << "' not recognized\n";
    std::exit(1);
    return (double)0.;
}